

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1b8a13::CAPIBuildSystemFrontendDelegate::CAPIRulesVector::~CAPIRulesVector
          (CAPIRulesVector *this)

{
  bool bVar1;
  reference ppCVar2;
  CAPIBuildKey *rule;
  iterator __end2;
  iterator __begin2;
  vector<(anonymous_namespace)::CAPIBuildKey_*,_std::allocator<(anonymous_namespace)::CAPIBuildKey_*>_>
  *__range2;
  CAPIRulesVector *this_local;
  
  __end2 = std::
           vector<(anonymous_namespace)::CAPIBuildKey_*,_std::allocator<(anonymous_namespace)::CAPIBuildKey_*>_>
           ::begin(&this->rules);
  rule = (CAPIBuildKey *)
         std::
         vector<(anonymous_namespace)::CAPIBuildKey_*,_std::allocator<(anonymous_namespace)::CAPIBuildKey_*>_>
         ::end(&this->rules);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<(anonymous_namespace)::CAPIBuildKey_**,_std::vector<(anonymous_namespace)::CAPIBuildKey_*,_std::allocator<(anonymous_namespace)::CAPIBuildKey_*>_>_>
                                *)&rule);
    if (!bVar1) break;
    ppCVar2 = __gnu_cxx::
              __normal_iterator<(anonymous_namespace)::CAPIBuildKey_**,_std::vector<(anonymous_namespace)::CAPIBuildKey_*,_std::allocator<(anonymous_namespace)::CAPIBuildKey_*>_>_>
              ::operator*(&__end2);
    llb_build_key_destroy((llb_build_key_t *)*ppCVar2);
    __gnu_cxx::
    __normal_iterator<(anonymous_namespace)::CAPIBuildKey_**,_std::vector<(anonymous_namespace)::CAPIBuildKey_*,_std::allocator<(anonymous_namespace)::CAPIBuildKey_*>_>_>
    ::operator++(&__end2);
  }
  std::
  vector<(anonymous_namespace)::CAPIBuildKey_*,_std::allocator<(anonymous_namespace)::CAPIBuildKey_*>_>
  ::~vector(&this->rules);
  return;
}

Assistant:

~CAPIRulesVector() {
      for (auto rule : rules) {
        llb_build_key_destroy((llb_build_key_t *)rule);
      }
    }